

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O2

UChar * __thiscall
icu_63::Normalizer2Impl::decompose
          (Normalizer2Impl *this,UChar *src,UChar *limit,ReorderingBuffer *buffer,
          UErrorCode *errorCode)

{
  UChar UVar1;
  UChar UVar2;
  UCPTrie *trie;
  void *pvVar3;
  UChar *pUVar4;
  UBool UVar5;
  int iVar6;
  UChar *sLimit;
  ushort uVar7;
  UChar *pUVar8;
  uint16_t uVar9;
  UChar *pUVar10;
  byte bVar11;
  uint c;
  ushort norm16;
  bool bVar13;
  ushort uVar12;
  
  UVar1 = this->minDecompNoCP;
  if (limit == (UChar *)0x0) {
    src = copyLowPrefixFromNulTerminated(this,src,(uint)(ushort)UVar1,buffer,errorCode);
    if (U_ZERO_ERROR < *errorCode) {
      return src;
    }
    limit = u_strchr_63(src,L'\0');
  }
  c = 0;
  norm16 = 0;
  pUVar4 = src;
  uVar12 = 0;
  pUVar8 = src;
LAB_00287b87:
  sLimit = pUVar4;
  if (sLimit == limit) {
LAB_00287c94:
    bVar13 = sLimit == src;
    pUVar10 = sLimit;
    if (bVar13) {
      pUVar10 = pUVar8;
    }
    uVar7 = uVar12 & 0xff;
    if (!bVar13) {
      uVar7 = 0;
    }
    if ((!bVar13 && buffer != (ReorderingBuffer *)0x0) &&
       (UVar5 = ReorderingBuffer::appendZeroCC(buffer,src,sLimit,errorCode), pUVar10 = pUVar8,
       uVar7 = uVar12, UVar5 == '\0')) {
      return sLimit;
    }
    if (sLimit == limit) {
      return sLimit;
    }
    src = sLimit + (2 - (c < 0x10000));
    pUVar4 = src;
    pUVar8 = pUVar10;
    if (buffer == (ReorderingBuffer *)0x0) {
      if ((this->minYesNo <= norm16) && (norm16 < this->minMaybeYes)) {
        return pUVar10;
      }
      uVar12 = norm16 >> 1;
      if (norm16 < 0xfc00) {
        uVar12 = 0;
      }
      bVar11 = (byte)uVar12;
      if (bVar11 < 2) {
        pUVar8 = src;
      }
      if ((bVar11 != 0) && (bVar11 < (byte)uVar7)) {
        return pUVar10;
      }
    }
    else {
      UVar5 = decompose(this,c,norm16,buffer,errorCode);
      uVar12 = uVar7;
      if (UVar5 == '\0') {
        return src;
      }
    }
    goto LAB_00287b87;
  }
  UVar2 = *sLimit;
  c = (uint)(ushort)UVar2;
  if ((ushort)UVar1 <= (ushort)UVar2) {
    trie = this->normTrie;
    pvVar3 = (trie->data).ptr0;
    norm16 = *(ushort *)
              ((long)pvVar3 +
              (ulong)(((ushort)UVar2 & 0x3f) + (uint)trie->index[(ushort)UVar2 >> 6]) * 2);
    uVar9 = this->minYesNo;
    if ((norm16 & 0xfdff) != 0xfc00 && uVar9 <= norm16) {
      if (((ushort)UVar2 & 0xfc00) != 0xd800) goto LAB_00287c94;
      pUVar4 = sLimit + 1;
      if ((pUVar4 == limit) || ((*pUVar4 & 0xfc00U) != 0xdc00)) goto LAB_00287b87;
      c = (uint)(ushort)UVar2 * 0x400 + (uint)(ushort)*pUVar4 + 0xfca02400;
      if ((int)c < trie->highStart) {
        iVar6 = ucptrie_internalSmallIndex_63(trie,c);
        uVar9 = this->minYesNo;
      }
      else {
        iVar6 = trie->dataLength + -2;
      }
      norm16 = *(ushort *)((long)pvVar3 + (long)iVar6 * 2);
      pUVar4 = sLimit + 2;
      if (((norm16 & 0xfdff) == 0xfc00) || (norm16 < uVar9)) goto LAB_00287b87;
      goto LAB_00287c94;
    }
  }
  pUVar4 = sLimit + 1;
  goto LAB_00287b87;
}

Assistant:

const UChar *
Normalizer2Impl::decompose(const UChar *src, const UChar *limit,
                           ReorderingBuffer *buffer,
                           UErrorCode &errorCode) const {
    UChar32 minNoCP=minDecompNoCP;
    if(limit==NULL) {
        src=copyLowPrefixFromNulTerminated(src, minNoCP, buffer, errorCode);
        if(U_FAILURE(errorCode)) {
            return src;
        }
        limit=u_strchr(src, 0);
    }

    const UChar *prevSrc;
    UChar32 c=0;
    uint16_t norm16=0;

    // only for quick check
    const UChar *prevBoundary=src;
    uint8_t prevCC=0;

    for(;;) {
        // count code units below the minimum or with irrelevant data for the quick check
        for(prevSrc=src; src!=limit;) {
            if( (c=*src)<minNoCP ||
                isMostDecompYesAndZeroCC(norm16=UCPTRIE_FAST_BMP_GET(normTrie, UCPTRIE_16, c))
            ) {
                ++src;
            } else if(!U16_IS_LEAD(c)) {
                break;
            } else {
                UChar c2;
                if((src+1)!=limit && U16_IS_TRAIL(c2=src[1])) {
                    c=U16_GET_SUPPLEMENTARY(c, c2);
                    norm16=UCPTRIE_FAST_SUPP_GET(normTrie, UCPTRIE_16, c);
                    if(isMostDecompYesAndZeroCC(norm16)) {
                        src+=2;
                    } else {
                        break;
                    }
                } else {
                    ++src;  // unpaired lead surrogate: inert
                }
            }
        }
        // copy these code units all at once
        if(src!=prevSrc) {
            if(buffer!=NULL) {
                if(!buffer->appendZeroCC(prevSrc, src, errorCode)) {
                    break;
                }
            } else {
                prevCC=0;
                prevBoundary=src;
            }
        }
        if(src==limit) {
            break;
        }

        // Check one above-minimum, relevant code point.
        src+=U16_LENGTH(c);
        if(buffer!=NULL) {
            if(!decompose(c, norm16, *buffer, errorCode)) {
                break;
            }
        } else {
            if(isDecompYes(norm16)) {
                uint8_t cc=getCCFromYesOrMaybe(norm16);
                if(prevCC<=cc || cc==0) {
                    prevCC=cc;
                    if(cc<=1) {
                        prevBoundary=src;
                    }
                    continue;
                }
            }
            return prevBoundary;  // "no" or cc out of order
        }
    }
    return src;
}